

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_print.c
# Opt level: O3

int rfc5444_print_raw(autobuf *out,void *buffer,size_t length)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  size_t *psVar6;
  ulong uVar7;
  ulong uVar8;
  size_t length_00;
  ulong uVar9;
  uint8_t *ptr;
  uint8_t *puVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  size_t idx2;
  ulong local_a8;
  ulong local_a0;
  size_t *local_98;
  ulong local_90;
  ulong local_88;
  uint8_t *local_80;
  ulong local_78;
  ulong local_70;
  size_t local_68;
  uint8_t *local_60;
  ulong local_58;
  ulong local_50;
  size_t local_48;
  ulong local_40;
  ulong local_38;
  
  if (length == 0) {
    return -1;
  }
  abuf_puts(out,"\t,------------------\n");
  abuf_puts(out,"\t|  PACKET\n");
  abuf_puts(out,"\t|------------------\n");
  bVar1 = *buffer;
  abuf_appendf(out,"\t| Packet version:    %u\n",(ulong)(bVar1 >> 4));
  abuf_appendf(out,"\t| Packet flags:      0x%02x\n",(ulong)(bVar1 & 0xf));
  local_68 = 1;
  uVar12 = 1;
  if ((bVar1 & 8) != 0) {
    if (length < 3) {
      return -1;
    }
    abuf_appendf(out,"\t| Packet seq number: %u\n",(ulong)(ushort)(*buffer << 8 | *buffer >> 8));
    local_68 = 3;
    uVar12 = 3;
  }
  if (((bVar1 & 4) == 0) ||
     ((uVar12 + 2 <= length &&
      (iVar4 = _print_raw_tlvblock(out,"\t|    | ",(uint8_t *)buffer,&local_68,length),
      uVar12 = local_68, iVar4 == 0)))) {
    if (length <= uVar12) {
      return 0;
    }
    local_98 = (size_t *)((long)buffer + length);
    local_58 = length;
    while (local_a0 = uVar12 + 4, local_a0 <= local_58) {
      abuf_puts(out,"\t|    ,-------------------\n");
      abuf_puts(out,"\t|    |  MESSAGE\n");
      abuf_puts(out,"\t|    |-------------------\n");
      abuf_appendf(out,"\t|    | Message type:       %u\n",(ulong)*(byte *)((long)buffer + uVar12));
      bVar1 = *(byte *)((long)buffer + uVar12 + 1);
      abuf_appendf(out,"\t|    | Message flags:      0x%02x\n",(ulong)(bVar1 >> 4));
      length_00 = (ulong)(bVar1 & 0xf) + 1;
      abuf_appendf(out,"\t|    | Address length:     %u\n",length_00);
      uVar3 = *(ushort *)((long)buffer + uVar12 + 2);
      uVar13 = (ulong)(ushort)(uVar3 << 8 | uVar3 >> 8);
      abuf_appendf(out,"\t|    | Size:             %u\n",uVar13);
      uVar8 = local_a0;
      local_a8 = local_a0;
      local_88 = (ulong)bVar1;
      local_78 = uVar13;
      local_48 = length_00;
      if ((char)bVar1 < '\0') {
        uVar7 = local_a0 + length_00;
        if (uVar13 + uVar12 < uVar7) {
          return -1;
        }
        abuf_appendf(out,"\t|    | Originator address: ");
        _print_hex(out,(uint8_t *)(uVar8 + (long)buffer),length_00,(uint8_t *)local_98);
        local_a8 = uVar7;
      }
      uVar13 = local_78;
      uVar8 = local_88;
      if ((local_88 & 0x40) != 0) {
        uVar7 = local_a8 + 1;
        if (uVar12 + local_78 < uVar7) {
          return -1;
        }
        abuf_appendf(out,"\t|    | Hop limit:          %u\n",
                     (ulong)*(byte *)((long)buffer + local_a8));
        local_a8 = uVar7;
      }
      if ((uVar8 & 0x20) != 0) {
        uVar7 = local_a8 + 1;
        if (uVar12 + uVar13 < uVar7) {
          return -1;
        }
        abuf_appendf(out,"\t|    | Hop count:          %u\n",
                     (ulong)*(byte *)((long)buffer + local_a8));
        local_a8 = uVar7;
      }
      if ((uVar8 & 0x10) != 0) {
        uVar8 = local_a8 + 2;
        if (uVar12 + uVar13 < uVar8) {
          return -1;
        }
        abuf_appendf(out,"\t|    | Sequence Number:    %u\n",
                     (ulong)(ushort)(*(ushort *)((long)buffer + local_a8) << 8 |
                                    *(ushort *)((long)buffer + local_a8) >> 8));
        local_a8 = uVar8;
      }
      psVar6 = &local_a8;
      iVar4 = _print_raw_tlvblock(out,"\t|    |    ",(uint8_t *)buffer,psVar6,uVar13);
      if (iVar4 != 0) {
        return -1;
      }
      local_70 = uVar12 + uVar13;
      local_78 = uVar13;
      local_50 = uVar12;
      while (uVar8 = local_70, uVar12 = local_a8, local_a8 < local_70) {
        uVar13 = local_a8 + 2;
        if (local_70 < uVar13) {
          return -1;
        }
        abuf_puts(out,"\t|    |    ,-------------------\n");
        abuf_puts(out,"\t|    |    |  ADDRESS-BLOCK\n");
        abuf_puts(out,"\t|    |    |-------------------\n");
        bVar1 = *(byte *)((long)buffer + uVar12);
        uVar9 = (ulong)bVar1;
        local_88 = 0;
        abuf_appendf(out,"\t|    |    | Num-Addr: %u\n",uVar9);
        bVar2 = *(byte *)((long)buffer + uVar12 + 1);
        uVar7 = (ulong)bVar2;
        abuf_appendf(out,"\t|    |    | Flags:    0x%02x\n",uVar7);
        if ((char)bVar2 < '\0') {
          uVar12 = uVar12 + 3;
          if (uVar8 < uVar12) {
            return -1;
          }
          bVar2 = *(byte *)((long)buffer + uVar13);
          local_88 = CONCAT71((int7)((ulong)psVar6 >> 8),bVar2);
          uVar13 = bVar2 + uVar12;
          if (uVar8 < uVar13) {
            return -1;
          }
          local_90 = uVar7;
          abuf_appendf(out,"\t|    |    | Head:     ");
          psVar6 = local_98;
          local_60 = (uint8_t *)(uVar12 + (long)buffer);
          _print_hex(out,(uint8_t *)(uVar12 + (long)buffer),(ulong)bVar2,(uint8_t *)local_98);
          abuf_puts(out,"\n");
          uVar7 = local_90;
          uVar8 = local_70;
        }
        else {
          local_60 = (uint8_t *)0x0;
        }
        if ((uVar7 & 0x40) == 0) {
          local_a0 = 0;
          puVar10 = (uint8_t *)0x0;
        }
        else {
          local_a8 = uVar13 + 1;
          if (uVar8 < local_a8) {
            return -1;
          }
          bVar2 = *(byte *)((long)buffer + uVar13);
          local_a0 = CONCAT71((int7)((ulong)psVar6 >> 8),bVar2);
          uVar13 = local_a8 + bVar2;
          if (uVar8 < uVar13) {
            return -1;
          }
          local_80 = (uint8_t *)(local_a8 + (long)buffer);
          local_90 = uVar7;
          abuf_appendf(out,"\t|    |    | Tail:     ");
          _print_hex(out,local_80,(ulong)bVar2,(uint8_t *)local_98);
          abuf_puts(out,"\n");
          uVar7 = local_90;
          puVar10 = local_80;
        }
        if ((uVar7 & 0x20) != 0) {
          if (uVar8 < uVar13 + 1) {
            return -1;
          }
          bVar2 = *(byte *)((long)buffer + uVar13);
          abuf_appendf(out,"\t|    |    | ZeroTail: ");
          _print_hex(out,rfc5444_print_raw::ZEROTAIL,(ulong)bVar2,(uint8_t *)local_98);
          abuf_puts(out,"\n");
          puVar10 = rfc5444_print_raw::ZEROTAIL;
          uVar8 = local_70;
          local_a0 = CONCAT71((int7)(uVar13 >> 8),bVar2);
          uVar13 = uVar13 + 1;
        }
        local_38 = local_88 & 0xff;
        local_40 = local_a0 & 0xff;
        uVar5 = (int)local_40 + (uint)(byte)local_88;
        iVar4 = (uint)local_48 - uVar5;
        if ((uint)local_48 < uVar5 || iVar4 == 0) {
          return -1;
        }
        uVar12 = (ulong)(iVar4 * (uint)bVar1 & 0xffff);
        if (uVar8 < uVar12 + uVar13) {
          return -1;
        }
        lVar11 = uVar12 + local_50;
        if ((uVar7 & 0x10) == 0) {
          if ((uVar7 & 8) != 0) {
            uVar12 = lVar11 + uVar9;
            goto LAB_0014d009;
          }
          lVar11 = 0;
        }
        else {
          uVar12 = lVar11 + 1;
LAB_0014d009:
          if (uVar8 < uVar12) {
            return -1;
          }
        }
        if (bVar1 != 0) {
          local_90 = (ulong)((uint)(uVar7 >> 3) & 1);
          local_80 = puVar10;
          do {
            abuf_puts(out,"\t|    |    |    ,-------------------\n");
            abuf_puts(out,"\t|    |    |    |  Address\n");
            abuf_puts(out,"\t|    |    |    |-------------------\n");
            abuf_appendf(out,"\t|    |    |    | Address: ");
            psVar6 = local_98;
            if ((byte)local_88 != '\0') {
              _print_hex(out,local_60,local_38,(uint8_t *)local_98);
              abuf_puts(out," | ");
            }
            _print_hex(out,(uint8_t *)((long)buffer + uVar13),(long)iVar4,(uint8_t *)psVar6);
            if ((char)local_a0 != '\0') {
              abuf_puts(out," | ");
              _print_hex(out,local_80,local_40,(uint8_t *)psVar6);
            }
            if (lVar11 != 0) {
              abuf_appendf(out," / %u",(ulong)*(byte *)((long)buffer + lVar11));
            }
            uVar13 = uVar13 + (long)iVar4;
            lVar11 = lVar11 + local_90;
            abuf_puts(out,"\n");
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
        psVar6 = &local_a8;
        local_a8 = uVar13;
        iVar4 = _print_raw_tlvblock(out,"\t|    |    |    ",(uint8_t *)buffer,psVar6,local_78);
        if (iVar4 != 0) {
          return -1;
        }
      }
      if (local_a8 != local_70) {
        return -1;
      }
      uVar12 = local_70;
      if (local_58 <= local_70) {
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

int
rfc5444_print_raw(struct autobuf *out, void *buffer, size_t length) {
  static uint8_t ZEROTAIL[] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
  uint8_t *ptr, *end;
  size_t idx, idx2, prefix_idx, i;
  uint8_t flags, head_len, tail_len, *head, *tail, num_addr;
  uint16_t msg_size, addr_length, mid_len;

  ptr = buffer;
  idx = 0;
  end = &ptr[length];
  
  if (idx + 1 > length) {
    return -1;
  }

  abuf_puts(out, "\t,------------------\n");
  abuf_puts(out, "\t|  PACKET\n");
  abuf_puts(out, "\t|------------------\n");

  flags = ptr[0];
  abuf_appendf(out, "\t| Packet version:    %u\n", flags >> 4);
  abuf_appendf(out, "\t| Packet flags:      0x%02x\n", flags & 0x0f);
  idx++;

  if (flags & RFC5444_PKT_FLAG_SEQNO) {
    if (idx + 2 > length) {
      return -1;
    }

    abuf_appendf(out, "\t| Packet seq number: %u\n", (ptr[0] << 8) | ptr[1]);
    idx += 2;
  }

  if (flags & RFC5444_PKT_FLAG_TLV) {
    if (idx + 2 > length) {
      return -1;
    }
    if (_print_raw_tlvblock(out, "\t|    | ", ptr, &idx, length)) {
      return -1;
    }
  }

  while (idx < length) {
    idx2 = idx;

    /* print messages */
    if (idx2 + 4 > length) {
      return -1;
    }

    abuf_puts(out, "\t|    ,-------------------\n");
    abuf_puts(out, "\t|    |  MESSAGE\n");
    abuf_puts(out, "\t|    |-------------------\n");
    abuf_appendf(out, "\t|    | Message type:       %u\n", ptr[idx]);

    flags = ptr[idx2 + 1];
    abuf_appendf(out, "\t|    | Message flags:      0x%02x\n", flags >> 4);

    addr_length = (flags & 15) + 1;
    abuf_appendf(out, "\t|    | Address length:     %u\n", addr_length);

    msg_size = (ptr[idx2 + 2] << 8) + ptr[idx + 3];
    abuf_appendf(out, "\t|    | Size:             %u\n", msg_size);
    idx2 += 4;

    if (flags & RFC5444_MSG_FLAG_ORIGINATOR) {
      if (idx2 + addr_length > idx + msg_size) {
        return -1;
      }
      abuf_appendf(out, "\t|    | Originator address: ");
      _print_hex(out, &ptr[idx2], addr_length, end);
      idx2 += addr_length;
    }
    if (flags & RFC5444_MSG_FLAG_HOPLIMIT) {
      if (idx2 + 1 > idx + msg_size) {
        return -1;
      }
      abuf_appendf(out, "\t|    | Hop limit:          %u\n", ptr[idx2]);
      idx2++;
    }
    if (flags & RFC5444_MSG_FLAG_HOPCOUNT) {
      if (idx2 + 1 > idx + msg_size) {
        return -1;
      }
      abuf_appendf(out, "\t|    | Hop count:          %u\n", ptr[idx2]);
      idx2++;
    }
    if (flags & RFC5444_MSG_FLAG_SEQNO) {
      if (idx2 + 2 > idx + msg_size) {
        return -1;
      }
      abuf_appendf(out, "\t|    | Sequence Number:    %u\n", (ptr[idx2] << 8) | ptr[idx2 + 1]);
      idx2 += 2;
    }

    if (_print_raw_tlvblock(out, "\t|    |    ", ptr, &idx2, msg_size)) {
      return -1;
    }

    while (idx2 < idx + msg_size) {
      /* print address blocks */
      if (idx2 + 2 > idx + msg_size) {
        return -1;
      }

      abuf_puts(out, "\t|    |    ,-------------------\n");
      abuf_puts(out, "\t|    |    |  ADDRESS-BLOCK\n");
      abuf_puts(out, "\t|    |    |-------------------\n");

      num_addr = ptr[idx2];
      abuf_appendf(out, "\t|    |    | Num-Addr: %u\n", num_addr);

      flags = ptr[idx2 + 1];
      abuf_appendf(out, "\t|    |    | Flags:    0x%02x\n", flags);

      idx2 += 2;

      head_len = tail_len = 0;
      head = NULL;
      tail = NULL;
      if (flags & RFC5444_ADDR_FLAG_HEAD) {
        if (idx2 + 1 > idx + msg_size) {
          return -1;
        }

        head_len = ptr[idx2];
        idx2++;
        if (idx2 + head_len > idx + msg_size) {
          return -1;
        }

        head = &ptr[idx2];

        abuf_appendf(out, "\t|    |    | Head:     ");
        _print_hex(out, head, head_len, end);
        abuf_puts(out, "\n");

        idx2 += head_len;
      }
      if (flags & RFC5444_ADDR_FLAG_FULLTAIL) {
        if (idx2 + 1 > idx + msg_size) {
          return -1;
        }

        tail_len = ptr[idx2];
        idx2++;
        if (idx2 + tail_len > idx + msg_size) {
          return -1;
        }

        tail = &ptr[idx2];
        abuf_appendf(out, "\t|    |    | Tail:     ");
        _print_hex(out, tail, tail_len, end);
        abuf_puts(out, "\n");
        idx2 += tail_len;
      }
      if (flags & RFC5444_ADDR_FLAG_ZEROTAIL) {
        if (idx2 + 1 > idx + msg_size) {
          return -1;
        }

        tail_len = ptr[idx2];

        tail = ZEROTAIL;
        abuf_appendf(out, "\t|    |    | ZeroTail: ");
        _print_hex(out, tail, tail_len, end);
        abuf_puts(out, "\n");

        idx2++;
      }

      if (head_len + tail_len >= addr_length) {
        return -1;
      }

      mid_len = (addr_length - head_len - tail_len) * num_addr;
      if (idx2 + mid_len > idx + msg_size) {
        return -1;
      }

      prefix_idx = idx + mid_len;
      if (flags & RFC5444_ADDR_FLAG_SINGLEPLEN) {
        if (prefix_idx + 1 > idx + msg_size) {
          return -1;
        }
      }
      else if (flags & RFC5444_ADDR_FLAG_MULTIPLEN) {
        if (prefix_idx + num_addr > idx + msg_size) {
          return -1;
        }
      }
      else {
        prefix_idx = 0;
      }

      for (i = 0; i < num_addr; i++) {
        abuf_puts(out, "\t|    |    |    ,-------------------\n");
        abuf_puts(out, "\t|    |    |    |  Address\n");
        abuf_puts(out, "\t|    |    |    |-------------------\n");

        abuf_appendf(out, "\t|    |    |    | Address: ");

        if (head_len) {
          _print_hex(out, head, head_len, end);

          abuf_puts(out, " | ");
        }
        _print_hex(out, &ptr[idx2], addr_length - head_len - tail_len, end);
        idx2 += addr_length - head_len - tail_len;

        if (tail_len) {
          abuf_puts(out, " | ");

          _print_hex(out, tail, tail_len, end);
        }

        if (prefix_idx) {
          abuf_appendf(out, " / %u", ptr[prefix_idx]);
        }
        if (flags & RFC5444_ADDR_FLAG_MULTIPLEN) {
          prefix_idx++;
        }

        abuf_puts(out, "\n");
      }

      if (_print_raw_tlvblock(out, "\t|    |    |    ", ptr, &idx2, msg_size)) {
        return -1;
      }
    }

    if (idx + msg_size != idx2) {
      return -1;
    }

    idx = idx2;
  }

  return 0;
}